

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

void __thiscall QMdiAreaPrivate::activateCurrentWindow(QMdiAreaPrivate *this)

{
  bool bVar1;
  QMdiSubWindow *pQVar2;
  QMdiSubWindowPrivate *pQVar3;
  QMdiAreaPrivate *in_RDI;
  QMdiSubWindow *current;
  bool in_stack_0000005e;
  bool in_stack_0000005f;
  QMdiSubWindowPrivate *in_stack_00000060;
  
  q_func(in_RDI);
  pQVar2 = QMdiArea::currentSubWindow((QMdiArea *)current);
  if (pQVar2 != (QMdiSubWindow *)0x0) {
    bVar1 = isExplicitlyDeactivated(in_RDI,(QMdiSubWindow *)0x61166e);
    if (!bVar1) {
      pQVar3 = QMdiSubWindow::d_func((QMdiSubWindow *)0x61167c);
      pQVar3->activationEnabled = true;
      QMdiSubWindow::d_func((QMdiSubWindow *)0x61168d);
      QMdiSubWindowPrivate::setActive(in_stack_00000060,in_stack_0000005f,in_stack_0000005e);
    }
  }
  return;
}

Assistant:

void QMdiAreaPrivate::activateCurrentWindow()
{
    QMdiSubWindow *current = q_func()->currentSubWindow();
    if (current && !isExplicitlyDeactivated(current)) {
        current->d_func()->activationEnabled = true;
        current->d_func()->setActive(true, /*changeFocus=*/false);
    }
}